

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<char>::resizeRealloc<slang::SmallVectorBase<char>::ValueInitTag>
          (SmallVectorBase<char> *this,size_type newSize,ValueInitTag *val)

{
  char *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  iterator __result;
  char *in_RSI;
  EVP_PKEY_CTX *ctx;
  SmallVectorBase<char> *in_RDI;
  pointer newData;
  size_type newCap;
  char *__last;
  SmallVectorBase<char> *in_stack_ffffffffffffffd8;
  
  __last = in_RSI;
  pcVar1 = (char *)max_size((SmallVectorBase<char> *)0x407263);
  if (pcVar1 < __last) {
    detail::throwLengthError();
  }
  sVar2 = calculateGrowth(in_stack_ffffffffffffffd8,(size_type)in_RDI);
  pcVar3 = (pointer)operator_new(0x407297);
  __result = begin(in_RDI);
  end(in_RDI);
  std::uninitialized_move<char*,char*>((char *)in_RDI,__last,__result);
  ctx = (EVP_PKEY_CTX *)(pcVar3 + in_RDI->len);
  std::ranges::__uninitialized_value_construct_n_fn::operator()<char_*>
            ((__uninitialized_value_construct_n_fn *)in_RDI,__last,
             (iter_difference_t<char_*>)__result);
  cleanup(in_RDI,ctx);
  in_RDI->len = (size_type)in_RSI;
  in_RDI->cap = sVar2;
  in_RDI->data_ = pcVar3;
  return;
}

Assistant:

void SmallVectorBase<T>::resizeRealloc(size_type newSize, const TVal& val) {
    SLANG_ASSERT(newSize > len);
    if (newSize > max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(newSize);
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    std::uninitialized_move(begin(), end(), newData);

    if constexpr (std::is_same_v<T, TVal>) {
        std::ranges::uninitialized_fill_n(newData + len, ptrdiff_t(newSize - len), val);
    }
    else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
        std::ranges::uninitialized_default_construct_n(newData + len, ptrdiff_t(newSize - len));
    }
    else {
        std::ranges::uninitialized_value_construct_n(newData + len, ptrdiff_t(newSize - len));
    }

    cleanup();
    len = newSize;
    cap = newCap;
    data_ = newData;
}